

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O0

bool GetIntersection(ImVec2 p0,ImVec2 p1,ImVec2 p2,ImVec2 p3,ImVec2 *i)

{
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  float in_XMM3_Da;
  float in_XMM3_Db;
  double t;
  double s;
  ImVec2 s2;
  ImVec2 s1;
  ImVec2 local_40;
  ImVec2 local_38;
  float *local_30;
  float local_24;
  float fStack_20;
  undefined8 local_1c;
  undefined8 local_14;
  undefined8 local_c;
  bool local_1;
  
  local_30 = in_RDI;
  local_1c = in_XMM2_Qa;
  local_14 = in_XMM1_Qa;
  local_c = in_XMM0_Qa;
  local_24 = in_XMM3_Da;
  fStack_20 = in_XMM3_Db;
  ImVec2::ImVec2(&local_38);
  ImVec2::ImVec2(&local_40);
  fVar1 = (float)local_14 - (float)local_c;
  local_14._4_4_ = local_14._4_4_ - local_c._4_4_;
  local_24 = local_24 - (float)local_1c;
  fStack_20 = fStack_20 - local_1c._4_4_;
  fVar2 = (-local_14._4_4_ * ((float)local_c - (float)local_1c) +
          fVar1 * (local_c._4_4_ - local_1c._4_4_)) /
          (-local_24 * local_14._4_4_ + fVar1 * fStack_20);
  fVar3 = (local_24 * (local_c._4_4_ - local_1c._4_4_) +
          -(fStack_20 * ((float)local_c - (float)local_1c))) /
          (-local_24 * local_14._4_4_ + fVar1 * fStack_20);
  if ((((fVar2 < 0.0) || (1.0 < fVar2)) || (fVar3 < 0.0)) || (1.0 < fVar3)) {
    local_1 = false;
  }
  else {
    if (local_30 != (float *)0x0) {
      *local_30 = fVar3 * fVar1 + (float)local_c;
      local_30[1] = fVar3 * local_14._4_4_ + local_c._4_4_;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GetIntersection(ImVec2 p0, ImVec2 p1, ImVec2 p2, ImVec2 p3, ImVec2 *i) {

	ImVec2 s1, s2;
	s1.x = p1.x - p0.x;
	s1.y = p1.y - p0.y;
	s2.x = p3.x - p2.x;
	s2.y = p3.y - p2.y;

	double s = (-s1.y * (p0.x - p2.x) + s1.x * (p0.y - p2.y)) / (-s2.x * s1.y + s1.x * s2.y);
	double t = (s2.x * (p0.y - p2.y) - s2.y * (p0.x - p2.x)) / (-s2.x * s1.y + s1.x * s2.y);

	if (s >= 0 && s <= 1 && t >= 0 && t <= 1) {
		// Collision detected
		//
		if (i) {
			i->x = p0.x + (t * s1.x);
			i->y = p0.y + (t * s1.y);
		}
		return true;
	}

	return false; // No collision
}